

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
DenseHashMapMoveTest_EmplaceHint_SpeedComparison_Test::TestBody
          (DenseHashMapMoveTest_EmplaceHint_SpeedComparison_Test *this)

{
  const_iterator hint_00;
  bool bVar1;
  reference pvVar2;
  iterator iVar3;
  iterator iVar4;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> _Var5;
  int *args;
  type this_00;
  char *file;
  AssertionResult gtest_ar;
  rep emplace_hint_time;
  int i_2;
  iterator hint;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  h_1;
  rep emplace_time;
  time_point end;
  int i_1;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  h;
  time_point start;
  int j;
  int r;
  int i;
  vector<int,_std::allocator<int>_> v;
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffd88;
  pointer in_stack_fffffffffffffd90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  int line;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffdb0;
  Type type;
  int *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  Message *in_stack_fffffffffffffe08;
  AssertHelper *in_stack_fffffffffffffe10;
  AssertionResult local_1e8;
  rep local_1d8;
  duration<long,_std::ratio<1L,_1000000L>_> local_1d0;
  char *local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b4;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_1b0 [2];
  int local_174;
  iterator local_170;
  undefined4 local_158;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> local_153 [83];
  undefined8 local_100;
  rep local_f8;
  duration<long,_std::ratio<1L,_1000000L>_> local_f0;
  int *local_e8;
  undefined8 local_e0;
  undefined4 local_b8;
  int local_b4;
  undefined4 local_b0;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> local_ab [83];
  undefined8 local_58;
  int *local_50;
  int *local_48;
  int local_40;
  int local_3c;
  int local_38;
  vector<int,_std::allocator<int>_> local_20;
  
  std::allocator<int>::allocator((allocator<int> *)0x1078121);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
             CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             (allocator_type *)in_stack_fffffffffffffda0._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x1078147);
  for (local_38 = 0; local_38 < 5000000; local_38 = local_38 + 5) {
    local_3c = rand();
    for (local_40 = 0; local_40 < 5; local_40 = local_40 + 1) {
      in_stack_fffffffffffffdf4 = local_3c;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&local_20,(long)(local_38 + local_40));
      *pvVar2 = in_stack_fffffffffffffdf4;
    }
  }
  iVar3 = std::begin<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd88);
  local_48 = iVar3._M_current;
  iVar4 = std::end<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd88);
  local_50 = iVar4._M_current;
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  local_58 = std::chrono::_V2::system_clock::now();
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::libc_allocator_with_realloc
            (local_ab);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::dense_hash_map(in_stack_fffffffffffffdb0,
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                   (hasher *)in_stack_fffffffffffffda0._M_current,
                   (key_equal *)in_stack_fffffffffffffd98._M_current,
                   (allocator_type *)in_stack_fffffffffffffd90);
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc
            (local_ab);
  local_b0 = 0xffffffff;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::set_empty_key((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *)in_stack_fffffffffffffd90,(key_type *)in_stack_fffffffffffffd88);
  for (local_b4 = 0; local_b4 < 1000000; local_b4 = local_b4 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](&local_20,(long)local_b4);
    local_b8 = 0;
    google::
    dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
    ::emplace<int&,int>((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)in_stack_fffffffffffffda0._M_current,in_stack_fffffffffffffd98._M_current
                        ,&in_stack_fffffffffffffd90->first);
  }
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::~dense_hash_map((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)0x10783b8);
  local_e0 = std::chrono::_V2::system_clock::now();
  local_f8 = (rep)std::chrono::operator-
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffffd98._M_current,
                             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffffd90);
  _Var5 = std::chrono::
          duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffd88);
  local_f0.__r = _Var5.__r;
  args = (int *)std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_f0);
  local_e8 = args;
  local_100 = std::chrono::_V2::system_clock::now();
  local_58 = local_100;
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::libc_allocator_with_realloc
            (local_153);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::dense_hash_map(in_stack_fffffffffffffdb0,
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                   (hasher *)in_stack_fffffffffffffda0._M_current,
                   (key_equal *)in_stack_fffffffffffffd98._M_current,
                   (allocator_type *)in_stack_fffffffffffffd90);
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc
            (local_153);
  local_158 = 0xffffffff;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::set_empty_key((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *)in_stack_fffffffffffffd90,(key_type *)in_stack_fffffffffffffd88);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::begin((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)in_stack_fffffffffffffd90);
  for (local_174 = 0; local_174 < 1000000; local_174 = local_174 + 1) {
    google::
    dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::dense_hashtable_const_iterator(local_1b0,&local_170);
    std::vector<int,_std::allocator<int>_>::operator[](&local_20,(long)local_174);
    local_1b4 = 0;
    hint_00.pos = (pointer)iVar3._M_current;
    hint_00.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                  *)iVar4._M_current;
    hint_00.end._0_4_ = in_stack_fffffffffffffdf0;
    hint_00.end._4_4_ = in_stack_fffffffffffffdf4;
    in_stack_fffffffffffffd88 = local_1b0[0].ht;
    in_stack_fffffffffffffd90 = local_1b0[0].pos;
    in_stack_fffffffffffffd98._M_current = &(local_1b0[0].end)->first;
    google::
    dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
    ::emplace_hint<int&,int>
              ((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)_Var5.__r,hint_00,args,in_stack_fffffffffffffdc0);
  }
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::~dense_hash_map((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)0x10785fb);
  local_1c0 = std::chrono::_V2::system_clock::now();
  local_e0 = local_1c0;
  this_00 = std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffffd98._M_current,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffffd90);
  local_1d8 = this_00.__r;
  _Var5 = std::chrono::
          duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffd88);
  local_1d0.__r = _Var5.__r;
  file = (char *)std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_1d0);
  type = (Type)((ulong)_Var5.__r >> 0x20);
  local_1c8 = file;
  testing::internal::CmpHelperLE<long,long>
            ((char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             (char *)in_stack_fffffffffffffda0._M_current,
             (long *)in_stack_fffffffffffffd98._M_current,(long *)in_stack_fffffffffffffd90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdac);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00.__r);
    in_stack_fffffffffffffda0._M_current =
         (int *)testing::AssertionResult::failure_message((AssertionResult *)0x1078707);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00.__r,type,file,line,
               (char *)in_stack_fffffffffffffda0._M_current);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd90);
    testing::Message::~Message((Message *)0x1078764);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10787c9);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0._M_current);
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, EmplaceHint_SpeedComparison)
{
    static const int Elements = 1e6;
    static const int Duplicates = 5;

    std::vector<int> v(Elements * Duplicates);

    for (int i = 0; i < Elements * Duplicates; i += Duplicates)
    {
        auto r = std::rand();

        for (int j = 0; j < Duplicates; ++j)
            v[i + j] = r;
    }

    std::sort(std::begin(v), std::end(v));

    auto start = std::chrono::system_clock::now();

    {
        dense_hash_map<int, int> h;
        h.set_empty_key(-1);

        for (int i = 0; i < Elements; ++i)
            h.emplace(v[i], 0);
    }

    auto end = std::chrono::system_clock::now();
    auto emplace_time = std::chrono::duration_cast<std::chrono::microseconds>(end - start).count();

    start = std::chrono::system_clock::now();

    {
        dense_hash_map<int, int> h;
        h.set_empty_key(-1);

        auto hint = h.begin();
        for (int i = 0; i < Elements; ++i)
            hint = h.emplace_hint(hint, v[i], 0).first;
    }

    end = std::chrono::system_clock::now();
    auto emplace_hint_time = std::chrono::duration_cast<std::chrono::microseconds>(end - start).count();

    ASSERT_LE(emplace_hint_time, emplace_time);
}